

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O1

FT_Error sdf_generate_subdivision
                   (SDF_Params internal_params,SDF_Shape *shape,FT_UInt spread,FT_Bitmap *bitmap)

{
  SDF_Edge_Type SVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  FT_Bitmap *pFVar5;
  int iVar6;
  SDF_Edge *pSVar7;
  uint *puVar8;
  ulong uVar9;
  SDF_Contour *pSVar10;
  FT_Long FVar11;
  FT_Fixed FVar12;
  byte bVar13;
  char cVar14;
  ushort uVar15;
  undefined4 in_register_0000000c;
  long lVar16;
  ulong uVar17;
  char cVar18;
  FT_UInt max_splits;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  SDF_Edge *unaff_RBP;
  uint *puVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  SDF_Edge *pSVar32;
  FT_Memory pFVar33;
  ulong uVar34;
  long lVar35;
  SDF_Contour *pSVar36;
  ulong uVar37;
  long lVar38;
  SDF_Edge_ *pSVar39;
  SDF_Edge *pSVar40;
  long lVar41;
  bool bVar42;
  byte bVar43;
  SDF_Edge *new_edges;
  SDF_Contour *tempc;
  uint local_1b4;
  FT_Vector local_1b0;
  SDF_Contour *local_1a0;
  undefined8 local_198;
  SDF_Contour *local_190;
  uint local_184;
  uint *local_180;
  FT_Bitmap *local_178;
  FT_Memory local_170;
  long local_168;
  uint local_15c;
  FT_26D6_Vec local_158;
  long local_148;
  long lStack_140;
  long local_138;
  long lStack_130;
  FT_Pos local_128;
  FT_Pos FStack_120;
  ulong local_110;
  ulong local_108;
  SDF_Contour *local_100;
  ulong local_f8;
  ulong local_f0;
  long local_e8;
  long local_e0;
  ulong local_d8;
  SDF_Contour *local_d0;
  long local_c8;
  SDF_Edge_ *local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  FT_Int local_88;
  int local_84;
  uchar *local_80;
  ulong local_78;
  long local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_110 = CONCAT44(in_register_0000000c,spread);
  local_88 = internal_params.overload_sign;
  local_108 = internal_params._0_8_;
  bVar43 = 0;
  uVar23 = 6;
  if ((shape != (SDF_Shape *)0x0) && (pFVar33 = shape->memory, pFVar33 != (FT_Memory)0x0)) {
    local_198 = shape;
    local_178 = bitmap;
    if (shape->contours == (SDF_Contour *)0x0) {
      local_1a0 = (SDF_Contour *)0x0;
      uVar23 = 0;
    }
    else {
      local_1a0 = (SDF_Contour *)0x0;
      local_190 = shape->contours;
      do {
        pSVar40 = local_190->edges;
        local_1b0.x = 0;
        do {
          if (pSVar40 == (SDF_Edge *)0x0) {
            local_1b4 = 0;
            pSVar36 = (SDF_Contour *)ft_mem_qalloc(pFVar33,0x20,(FT_Error *)&local_1b4);
            if (local_1b4 == 0) {
              pSVar36->edges = (SDF_Edge *)0x0;
              pSVar36->next = (SDF_Contour_ *)0x0;
              (pSVar36->last_pos).x = 0;
              (pSVar36->last_pos).y = 0;
              pSVar36->next = local_1a0;
              pSVar36->edges = (SDF_Edge *)local_1b0.x;
              local_1b0.x = 0;
              local_158.x = (FT_Pos)local_190;
              local_190 = local_190->next;
              sdf_contour_done(pFVar33,(SDF_Contour **)&local_158);
              bVar42 = true;
              uVar23 = 0;
              local_1a0 = pSVar36;
            }
            else {
              bVar42 = false;
              uVar23 = local_1b4;
            }
            break;
          }
          SVar1 = pSVar40->edge_type;
          if (SVar1 == SDF_EDGE_CUBIC) {
            local_158.x = (pSVar40->start_pos).x;
            local_158.y = (pSVar40->start_pos).y;
            local_148 = (pSVar40->control_a).x;
            lStack_140 = (pSVar40->control_a).y;
            local_138 = (pSVar40->control_b).x;
            lStack_130 = (pSVar40->control_b).y;
            local_128 = (pSVar40->end_pos).x;
            FStack_120 = (pSVar40->end_pos).y;
            uVar22 = split_sdf_cubic(pFVar33,&local_158,0x20,(SDF_Edge **)&local_1b0);
LAB_00242d9c:
            if (uVar22 == 0) {
              pSVar40 = pSVar40->next;
              bVar42 = true;
              uVar23 = 0;
            }
            else {
              bVar42 = false;
              uVar23 = uVar22;
            }
          }
          else {
            if (SVar1 == SDF_EDGE_CONIC) {
              local_158.x = (pSVar40->start_pos).x;
              local_158.y = (pSVar40->start_pos).y;
              local_148 = (pSVar40->control_a).x;
              lStack_140 = (pSVar40->control_a).y;
              local_138 = (pSVar40->end_pos).x;
              lStack_130 = (pSVar40->end_pos).y;
              uVar27 = local_158.x + local_148 * -2 + local_138;
              uVar34 = -uVar27;
              if (0 < (long)uVar27) {
                uVar34 = uVar27;
              }
              uVar17 = local_158.y + lStack_130 + lStack_140 * -2;
              uVar27 = -uVar17;
              if (0 < (long)uVar17) {
                uVar27 = uVar17;
              }
              if ((int)uVar27 < (int)uVar34) {
                uVar27 = uVar34;
              }
              max_splits = 1;
              if (8 < (int)uVar27) {
                uVar34 = uVar27 & 0xffffffff;
                do {
                  max_splits = max_splits * 2;
                  uVar23 = (uint)uVar34;
                  uVar34 = uVar34 >> 2;
                } while (0x23 < uVar23);
              }
              uVar22 = split_sdf_conic(pFVar33,&local_158,max_splits,(SDF_Edge **)&local_1b0);
              goto LAB_00242d9c;
            }
            uVar22 = 6;
            if (SVar1 != SDF_EDGE_LINE) goto LAB_00242d9c;
            local_158.x = local_158.x & 0xffffffff00000000;
            pSVar7 = (SDF_Edge *)ft_mem_qalloc(pFVar33,0x50,(FT_Error *)&local_158);
            if ((uint)local_158.x == 0) {
              *(undefined8 *)&pSVar7->edge_type = 0;
              pSVar7->next = (SDF_Edge_ *)0x0;
              (pSVar7->control_b).x = 0;
              (pSVar7->control_b).y = 0;
              (pSVar7->control_a).x = 0;
              (pSVar7->control_a).y = 0;
              (pSVar7->end_pos).x = 0;
              (pSVar7->end_pos).y = 0;
              (pSVar7->start_pos).x = 0;
              (pSVar7->start_pos).y = 0;
              unaff_RBP = pSVar7;
            }
            bVar42 = false;
            uVar22 = 0;
            uVar23 = (uint)local_158.x;
            if ((uint)local_158.x == 0) {
              pSVar7 = pSVar40;
              pSVar32 = unaff_RBP;
              for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
                (pSVar32->start_pos).x = (pSVar7->start_pos).x;
                pSVar7 = (SDF_Edge *)((long)pSVar7 + (ulong)bVar43 * -0x10 + 8);
                pSVar32 = (SDF_Edge *)((long)pSVar32 + (ulong)bVar43 * -0x10 + 8);
              }
              unaff_RBP->next = (SDF_Edge_ *)local_1b0.x;
              local_1b0.x = (FT_Pos)unaff_RBP;
              goto LAB_00242d9c;
            }
          }
        } while (bVar42);
        shape = local_198;
        bitmap = local_178;
        if (!bVar42) goto LAB_00242e6e;
      } while (local_190 != (SDF_Contour *)0x0);
    }
    local_198->contours = local_1a0;
    shape = local_198;
    bitmap = local_178;
  }
LAB_00242e6e:
  local_1b4 = uVar23;
  if (local_1b4 == 0) {
    local_1b4 = 0;
    if (((shape == (SDF_Shape *)0x0 || bitmap == (FT_Bitmap *)0x0) ||
        ((int)local_110 - 0x21U < 0xffffffe1)) ||
       (pFVar33 = shape->memory, pFVar33 == (FT_Memory)0x0)) {
      local_1b4 = 6;
      puVar8 = (uint *)0x0;
      pFVar33 = (FT_Memory)0x0;
    }
    else {
      local_170 = pFVar33;
      puVar8 = (uint *)ft_mem_alloc(pFVar33,(ulong)(bitmap->rows * bitmap->width) * 0xc,
                                    (FT_Error *)&local_1b4);
      pFVar33 = local_170;
      if (local_1b4 == 0) {
        uVar34 = (ulong)(int)bitmap->width;
        uVar23 = bitmap->rows;
        local_180 = puVar8;
        if (uVar23 == 0 || uVar34 == 0) {
          local_1b4 = 0x13;
        }
        else {
          local_184 = (int)local_110 << 0x10;
          pSVar36 = (SDF_Contour *)(long)(int)uVar23;
          local_80 = bitmap->buffer;
          local_d0 = shape->contours;
          local_78 = local_110 & 0xffffffff;
          local_40 = local_108 & 0xffffffff;
          local_15c = uVar23;
          local_100 = pSVar36;
          local_f8 = uVar34;
          do {
            if (local_d0 == (SDF_Contour *)0x0) {
              puVar8 = local_180;
              pFVar33 = local_170;
              if (0 < (int)local_15c) {
                pSVar36 = (SDF_Contour *)0x0;
                local_198 = (SDF_Shape *)(CONCAT44(local_198._4_4_,-(uint)(local_88 == 0)) | 1);
                uVar27 = (ulong)local_184;
                uVar17 = uVar34 & 0xffffffff;
                local_1a0 = (SDF_Contour *)(uVar17 * 0xc);
                local_108 = local_108 >> 0x20;
                puVar26 = local_180;
                do {
                  local_190 = pSVar36;
                  if (0 < (int)uVar34) {
                    uVar34 = 0;
                    puVar8 = puVar26;
                    uVar23 = (uint)local_198;
                    do {
                      uVar22 = (uint)(byte)puVar8[2];
                      if ((byte)puVar8[2] == 0) {
                        *puVar8 = local_184;
                        uVar22 = uVar23;
                      }
                      uVar23 = uVar22;
                      if ((int)local_184 < (int)*puVar8) {
                        *puVar8 = local_184;
                      }
                      iVar6 = -(int)(char)uVar23;
                      if ((char)local_108 == '\0') {
                        iVar6 = (int)(char)uVar23;
                      }
                      uVar22 = *puVar8;
                      *puVar8 = (uint)((long)iVar6 * (long)(int)uVar22);
                      uVar37 = FT_DivFix((long)iVar6 * (long)(int)uVar22,uVar27);
                      iVar6 = (int)uVar37;
                      uVar28 = (ulong)(uint)-iVar6;
                      if (0 < iVar6) {
                        uVar28 = uVar37 & 0xffffffff;
                      }
                      uVar22 = (uint)(uVar28 >> 9);
                      uVar31 = 0x7f;
                      if ((uint)uVar28 < 0x10000) {
                        uVar31 = uVar22;
                      }
                      if (0 < iVar6) {
                        uVar22 = uVar31;
                      }
                      cVar18 = (char)uVar22;
                      if (0x7f < uVar22) {
                        cVar18 = -0x80;
                      }
                      cVar14 = (char)uVar22;
                      if (iVar6 < 0) {
                        cVar14 = -cVar18;
                      }
                      local_80[uVar34] = cVar14 + 0x80;
                      uVar34 = uVar34 + 1;
                      puVar8 = puVar8 + 3;
                    } while (uVar17 != uVar34);
                  }
                  pSVar36 = (SDF_Contour *)((long)&(local_190->last_pos).x + 1);
                  local_80 = local_80 + uVar17;
                  puVar26 = (uint *)((long)puVar26 + (long)local_1a0);
                  puVar8 = local_180;
                  uVar34 = local_f8;
                  pFVar33 = local_170;
                } while (pSVar36 != local_100);
              }
              goto LAB_00242edf;
            }
            pSVar39 = local_d0->edges;
            do {
              if (pSVar39 == (SDF_Edge *)0x0) {
                local_d0 = local_d0->next;
                uVar23 = 0;
                break;
              }
              uVar27 = (pSVar39->start_pos).x;
              uVar17 = (pSVar39->start_pos).y;
              uVar37 = (pSVar39->end_pos).x;
              uVar28 = (pSVar39->end_pos).y;
              SVar1 = pSVar39->edge_type;
              uVar9 = uVar17;
              uVar20 = uVar27;
              uVar24 = uVar17;
              uVar21 = uVar27;
              if (SVar1 == SDF_EDGE_LINE) {
LAB_00243032:
                if ((long)uVar37 < (long)uVar20) {
                  uVar20 = uVar37;
                }
                if ((long)uVar21 < (long)uVar37) {
                  uVar21 = uVar37;
                }
                if ((long)uVar28 < (long)uVar9) {
                  uVar9 = uVar28;
                }
                if ((long)uVar24 < (long)uVar28) {
                  uVar24 = uVar28;
                }
                uVar27 = uVar20 - 0x3f;
                if ((long)(uVar20 - 0x3f) < 0) {
                  uVar27 = uVar20;
                }
                iVar6 = (int)(uVar27 >> 6);
                lVar16 = uVar21 + 0x7e;
                if (-1 < (long)(uVar21 + 0x3f)) {
                  lVar16 = uVar21 + 0x3f;
                }
                lVar16 = lVar16 >> 6;
                uVar27 = uVar9 - 0x3f;
                if ((long)(uVar9 - 0x3f) < 0) {
                  uVar27 = uVar9;
                }
                iVar19 = (int)(uVar27 >> 6);
                lVar25 = uVar24 + 0x7e;
                if (-1 < (long)(uVar24 + 0x3f)) {
                  lVar25 = uVar24 + 0x3f;
                }
                lVar25 = lVar25 >> 6;
              }
              else {
                uVar2 = (pSVar39->control_a).x;
                uVar3 = (pSVar39->control_a).y;
                uVar24 = uVar3;
                uVar9 = uVar3;
                uVar20 = uVar2;
                uVar21 = uVar2;
                if (SVar1 == SDF_EDGE_CONIC) {
LAB_00243002:
                  if ((long)uVar27 < (long)uVar20) {
                    uVar20 = uVar27;
                  }
                  if ((long)uVar21 < (long)uVar27) {
                    uVar21 = uVar27;
                  }
                  if ((long)uVar17 < (long)uVar9) {
                    uVar9 = uVar17;
                  }
                  if ((long)uVar24 < (long)uVar17) {
                    uVar24 = uVar17;
                  }
                  goto LAB_00243032;
                }
                if (SVar1 == SDF_EDGE_CUBIC) {
                  uVar21 = (pSVar39->control_b).x;
                  uVar24 = (pSVar39->control_b).y;
                  uVar20 = uVar21;
                  if ((long)uVar2 < (long)uVar21) {
                    uVar20 = uVar2;
                  }
                  if ((long)uVar21 < (long)uVar2) {
                    uVar21 = uVar2;
                  }
                  uVar9 = uVar24;
                  if ((long)uVar3 < (long)uVar24) {
                    uVar9 = uVar3;
                  }
                  if ((long)uVar24 < (long)uVar3) {
                    uVar24 = uVar3;
                  }
                  goto LAB_00243002;
                }
                iVar6 = 0;
                iVar19 = 0;
                lVar16 = 0;
                lVar25 = 0;
              }
              lVar38 = (long)(iVar19 - (int)local_110);
              if (lVar38 < (long)(lVar25 + local_78)) {
                lVar16 = lVar16 + local_78;
                local_70 = (long)(iVar6 - (int)local_110);
                local_c8 = lVar16;
                local_c0 = pSVar39;
                local_50 = lVar25 + local_78;
                do {
                  if (local_70 < lVar16) {
                    local_178 = (FT_Bitmap *)(lVar38 << 6 | 0x20);
                    local_68 = (long)local_178 << 10;
                    uVar23 = ~(uint)lVar38 + local_15c;
                    if (local_108 >> 0x28 != 0) {
                      uVar23 = (uint)lVar38;
                    }
                    local_48 = (ulong)(uVar23 * (int)uVar34);
                    lVar25 = local_70;
                    local_b8 = lVar38;
                    do {
                      pFVar5 = local_178;
                      uVar23 = 0x10;
                      if (((lVar25 < (long)uVar34) &&
                          ((((uint)lVar25 | (uint)lVar38) & 0x80000000) == 0)) &&
                         (lVar38 < (long)pSVar36)) {
                        pSVar10 = (SDF_Contour *)(lVar25 << 6 | 0x20);
                        SVar1 = pSVar39->edge_type;
                        local_190 = pSVar10;
                        if (SVar1 == SDF_EDGE_CUBIC) {
                          local_98 = (pSVar39->start_pos).x;
                          local_a0 = (pSVar39->start_pos).y;
                          lVar16 = (pSVar39->control_a).x;
                          lVar38 = (pSVar39->control_a).y;
                          lVar35 = (pSVar39->control_b).x;
                          lVar41 = (pSVar39->control_b).y;
                          local_b0 = ((local_98 - lVar16) - lVar16) + lVar35;
                          local_38 = ((local_a0 - lVar38) - lVar38) + lVar41;
                          local_e8 = (lVar16 - local_98) * 3;
                          local_e0 = (lVar38 - local_a0) * 3;
                          local_1a0 = (SDF_Contour *)
                                      (long)((((int)lVar16 - (int)lVar35) * 3 - (int)local_98) +
                                            (int)(pSVar39->end_pos).x);
                          local_198 = (SDF_Shape *)(local_b0 * 0x300000000 >> 0x20);
                          local_a8 = (lVar16 - local_98) * 0x300000000 >> 0x20;
                          lVar16 = (long)((((int)lVar38 - (int)lVar41) * 3 - (int)local_a0) +
                                         (int)(pSVar39->end_pos).y);
                          lVar35 = local_38 * 0x300000000 >> 0x20;
                          local_f0 = (lVar38 - local_a0) * 0x300000000 >> 0x20;
                          local_b0 = local_b0 * 6;
                          local_38 = local_38 * 6;
                          uVar34 = 0x7fffffff;
                          iVar6 = 0;
                          local_58 = 0;
                          local_60 = 0;
                          local_168 = lVar25;
                          local_90 = lVar16;
                          do {
                            uVar23 = iVar6 << 0xe;
                            local_d8 = 0;
                            local_84 = iVar6;
                            do {
                              lVar25 = (long)(int)uVar23;
                              uVar17 = lVar25 * lVar25 + 0x8000;
                              uVar22 = (uint)(uVar17 >> 0x10);
                              lVar38 = (long)(int)uVar22;
                              lVar41 = (long)(int)((ulong)(lVar38 * lVar25 + 0x8000 +
                                                          (lVar38 * lVar25 >> 0x3f)) >> 0x10);
                              lVar29 = lVar41 * (long)local_1a0;
                              lVar41 = lVar41 * lVar16;
                              lVar29 = ((int)((ulong)(lVar29 + 0x8000 + (lVar29 >> 0x3f)) >> 0x10) +
                                       (int)((ulong)(lVar38 * (long)local_198 + 0x8000 +
                                                    (lVar38 * (long)local_198 >> 0x3f)) >> 0x10) +
                                       (int)((ulong)(local_a8 * lVar25 + 0x8000 +
                                                    (local_a8 * lVar25 >> 0x3f)) >> 0x10)) +
                                       local_98;
                              lVar25 = ((int)((ulong)(lVar41 + 0x8000 + (lVar41 >> 0x3f)) >> 0x10) +
                                       (int)((ulong)(lVar38 * lVar35 + 0x8000 +
                                                    (lVar38 * lVar35 >> 0x3f)) >> 0x10) +
                                       (int)(lVar25 * local_f0 + 0x8000 +
                                             ((long)(lVar25 * local_f0) >> 0x3f) >> 0x10)) +
                                       local_a0;
                              local_1b0.x = (lVar29 - (long)local_190) * 0x400;
                              local_1b0.y = (lVar25 - (long)local_178) * 0x400;
                              uVar27 = FT_Vector_Length(&local_1b0);
                              lVar16 = local_90;
                              if ((int)uVar27 < (int)uVar34) {
                                local_158.y = lVar25 * 0x400;
                                local_158.x = lVar29 * 0x400;
                                uVar34 = uVar27 & 0xffffffff;
                                local_60 = (ulong)uVar22;
                                local_58 = (ulong)uVar23;
                              }
                              iVar19 = (int)uVar34;
                              lVar41 = (long)((uVar17 >> 0x10) * 0x300000000) >> 0x20;
                              lVar25 = lVar41 * (long)local_1a0;
                              lVar38 = (long)local_198 * (ulong)(uVar23 * 2);
                              lVar38 = ((int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10) +
                                       (int)((ulong)(lVar38 + 0x8000 + (lVar38 >> 0x3f)) >> 0x10)) +
                                       local_e8;
                              lVar41 = lVar41 * local_90;
                              lVar25 = lVar35 * (ulong)(uVar23 * 2);
                              lVar41 = ((int)((ulong)(lVar41 + 0x8000 + (lVar41 >> 0x3f)) >> 0x10) +
                                       (int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10)) +
                                       local_e0;
                              lVar29 = (long)local_1a0 * (long)(int)(uVar23 * 6);
                              lVar30 = (int)(uVar23 * 6) * local_90;
                              lVar25 = local_1b0.x + 0x3ff;
                              if (-1 < local_1b0.x) {
                                lVar25 = local_1b0.x;
                              }
                              local_1b0.x = lVar25 >> 10;
                              lVar25 = local_1b0.y + 0x3ff;
                              if (-1 < local_1b0.y) {
                                lVar25 = local_1b0.y;
                              }
                              local_1b0.y = lVar25 >> 10;
                              uVar17 = local_1b0.x * lVar38;
                              uVar27 = uVar17 + 0x3f;
                              if (-1 < (long)uVar17) {
                                uVar27 = uVar17;
                              }
                              uVar37 = local_1b0.y * lVar41;
                              uVar17 = uVar37 + 0x3f;
                              if (-1 < (long)uVar37) {
                                uVar17 = uVar37;
                              }
                              uVar28 = local_1b0.x *
                                       ((int)((ulong)(lVar29 + 0x8000 + (lVar29 >> 0x3f)) >> 0x10) +
                                       local_b0);
                              uVar37 = uVar28 + 0x3f;
                              if (-1 < (long)uVar28) {
                                uVar37 = uVar28;
                              }
                              uVar21 = local_1b0.y *
                                       ((int)((ulong)(lVar30 + 0x8000 + (lVar30 >> 0x3f)) >> 0x10) +
                                       local_38);
                              uVar28 = uVar21 + 0x3f;
                              if (-1 < (long)uVar21) {
                                uVar28 = uVar21;
                              }
                              FVar11 = FT_DivFix((long)((int)(uVar17 >> 6) + (int)(uVar27 >> 6)),
                                                 (long)((int)(uVar28 >> 6) + (int)(uVar37 >> 6) +
                                                       (int)((ulong)(lVar38 * lVar38) >> 6) +
                                                       (int)((ulong)(lVar41 * lVar41) >> 6)));
                              uVar23 = uVar23 - (int)FVar11;
                            } while ((uVar23 < 0x10001) &&
                                    (uVar27 = (ulong)((int)local_d8 + 1), uVar15 = (ushort)local_d8,
                                    local_d8 = uVar27, uVar15 < 3));
                            iVar6 = local_84 + 1;
                          } while (iVar6 != 5);
                          lVar25 = (long)((int)local_60 * 3);
                          lVar38 = (long)local_1a0 * lVar25;
                          uVar34 = (ulong)(uint)((int)local_58 * 2);
                          lVar41 = (long)local_198 * uVar34;
                          local_1b0.x = ((int)((ulong)(lVar38 + 0x8000 + (lVar38 >> 0x3f)) >> 0x10)
                                        + (int)((ulong)(lVar41 + 0x8000 + (lVar41 >> 0x3f)) >> 0x10)
                                        ) + local_e8;
                          lVar16 = lVar16 * lVar25;
                          lVar35 = lVar35 * uVar34;
                          local_1b0.y = ((int)((ulong)(lVar16 + 0x8000 + (lVar16 >> 0x3f)) >> 0x10)
                                        + (int)((ulong)(lVar35 + 0x8000 + (lVar35 >> 0x3f)) >> 0x10)
                                        ) + local_e0;
                          lVar25 = (long)(int)local_1b0.y *
                                   (long)(int)(SDF_Contour *)
                                              (local_158.x + (long)local_190 * -0x20 * 0x20);
                          lVar16 = (long)(int)local_1b0.x * (long)(int)(local_158.y - local_68);
                          uVar22 = 0x10000;
                          if ((local_58 & 0xfffeffff) == 0) {
                            local_158.x = local_158.x + (long)local_190 * -0x20 * 0x20;
                            local_158.y = local_158.y - local_68;
                            FT_Vector_NormLen(&local_1b0);
                            FT_Vector_NormLen(&local_158);
                            uVar22 = (int)((ulong)((long)(int)local_158.y * (long)(int)local_1b0.x +
                                                   0x8000 + ((long)(int)local_158.y *
                                                             (long)(int)local_1b0.x >> 0x3f)) >>
                                          0x10) -
                                     (int)((ulong)((long)(int)(uint)local_158.x *
                                                   (long)(int)local_1b0.y + 0x8000 +
                                                  ((long)(int)(uint)local_158.x *
                                                   (long)(int)local_1b0.y >> 0x3f)) >> 0x10);
                          }
                          bVar43 = -((int)((ulong)(lVar16 + 0x8000 + (lVar16 >> 0x3f)) >> 0x10) <=
                                    (int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10)) | 1;
                          local_1b4 = 0;
                          bVar42 = true;
                          uVar34 = local_f8;
                          pSVar36 = local_100;
                          lVar38 = local_b8;
                          pSVar39 = local_c0;
                          lVar16 = local_c8;
                          lVar25 = local_168;
                        }
                        else if (SVar1 == SDF_EDGE_CONIC) {
                          local_158.x = 0;
                          local_158.y = 0;
                          local_d8 = (pSVar39->start_pos).x;
                          local_e0 = (pSVar39->start_pos).y;
                          lVar16 = (pSVar39->control_a).x;
                          lVar38 = (pSVar39->control_a).y;
                          local_98 = ((local_d8 - lVar16) - lVar16) + (pSVar39->end_pos).x;
                          local_a8 = ((local_e0 - lVar38) - lVar38) + (pSVar39->end_pos).y;
                          local_198 = (SDF_Shape *)((lVar16 - local_d8) * 2);
                          local_1a0 = (SDF_Contour *)((lVar38 - local_e0) * 2);
                          lVar35 = (long)(int)local_98;
                          local_e8 = (long)(lVar16 - local_d8 << 0x21) >> 0x20;
                          lVar16 = (long)(int)local_a8;
                          local_90 = (lVar38 - local_e0 << 0x21) >> 0x20;
                          local_98 = local_98 * 2;
                          local_a8 = local_a8 * 2;
                          uVar34 = 0x7fffffff;
                          iVar6 = 0;
                          local_f0 = local_f0 & 0xffffffff00000000;
                          local_168 = lVar25;
                          local_a0 = lVar35;
                          do {
                            local_b0 = CONCAT44(local_b0._4_4_,iVar6);
                            uVar23 = iVar6 << 0xe;
                            uVar15 = 0;
                            do {
                              lVar38 = (long)(int)uVar23;
                              lVar25 = lVar38 * lVar38 * 0x10000 + 0x80000000 >> 0x20;
                              lVar35 = lVar25 * lVar35;
                              lVar41 = (long)((int)((ulong)(lVar35 + 0x8000 + (lVar35 >> 0x3f)) >>
                                                   0x10) +
                                             (int)((ulong)(local_e8 * lVar38 + 0x8000 +
                                                          (local_e8 * lVar38 >> 0x3f)) >> 0x10)) +
                                       local_d8;
                              lVar25 = lVar25 * lVar16;
                              lVar25 = ((int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10) +
                                       (int)((ulong)(lVar38 * local_90 + 0x8000 +
                                                    (lVar38 * local_90 >> 0x3f)) >> 0x10)) +
                                       local_e0;
                              local_1b0.x = (lVar41 - (long)local_190) * 0x400;
                              local_1b0.y = (lVar25 - (long)local_178) * 0x400;
                              uVar27 = FT_Vector_Length(&local_1b0);
                              lVar35 = local_a0;
                              if ((int)uVar27 < (int)uVar34) {
                                local_158.y = lVar25 * 0x400;
                                local_158.x = lVar41 * 0x400;
                                uVar34 = uVar27 & 0xffffffff;
                                local_f0 = CONCAT44(local_f0._4_4_,uVar23);
                              }
                              lVar25 = local_a0 * (ulong)(uVar23 * 2);
                              lVar38 = (long)&local_198->memory +
                                       (long)(int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >>
                                                  0x10);
                              lVar25 = (ulong)(uVar23 * 2) * lVar16;
                              lVar41 = (long)&(local_1a0->last_pos).x +
                                       (long)(int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >>
                                                  0x10);
                              lVar25 = local_1b0.x + 0x3ff;
                              if (-1 < local_1b0.x) {
                                lVar25 = local_1b0.x;
                              }
                              local_1b0.x = lVar25 >> 10;
                              lVar25 = local_1b0.y + 0x3ff;
                              if (-1 < local_1b0.y) {
                                lVar25 = local_1b0.y;
                              }
                              local_1b0.y = lVar25 >> 10;
                              uVar17 = local_1b0.x * lVar38;
                              uVar27 = uVar17 + 0x3f;
                              if (-1 < (long)uVar17) {
                                uVar27 = uVar17;
                              }
                              uVar37 = local_1b0.y * lVar41;
                              uVar17 = uVar37 + 0x3f;
                              if (-1 < (long)uVar37) {
                                uVar17 = uVar37;
                              }
                              uVar28 = local_1b0.x * local_98;
                              uVar37 = uVar28 + 0x3f;
                              if (-1 < (long)uVar28) {
                                uVar37 = uVar28;
                              }
                              uVar21 = local_1b0.y * local_a8;
                              uVar28 = uVar21 + 0x3f;
                              if (-1 < (long)uVar21) {
                                uVar28 = uVar21;
                              }
                              FVar11 = FT_DivFix((long)((int)(uVar17 >> 6) + (int)(uVar27 >> 6)),
                                                 (long)((int)(uVar28 >> 6) +
                                                       (int)(uVar37 >> 6) +
                                                       (int)((ulong)(lVar38 * lVar38) >> 6) +
                                                       (int)((ulong)(lVar41 * lVar41) >> 6)));
                              uVar23 = uVar23 - (int)FVar11;
                            } while ((uVar23 < 0x10001) &&
                                    (bVar42 = uVar15 < 3, uVar15 = uVar15 + 1, bVar42));
                            iVar6 = (int)local_b0 + 1;
                          } while (iVar6 != 5);
                          uVar27 = (ulong)(int)local_f0;
                          local_1b0.x = (long)&local_198->memory +
                                        ((long)(int)(lVar35 * uVar27 + 0x8000 +
                                                     ((long)(lVar35 * uVar27) >> 0x3f) >> 0xf) &
                                        0xfffffffffffffffeU);
                          local_1b0.y = (long)&(local_1a0->last_pos).x +
                                        ((long)(int)(lVar16 * uVar27 + 0x8000 +
                                                     ((long)(lVar16 * uVar27) >> 0x3f) >> 0xf) &
                                        0xfffffffffffffffeU);
                          lVar25 = (long)(int)local_1b0.y *
                                   (long)(int)(SDF_Contour *)
                                              (local_158.x + (long)local_190 * -0x20 * 0x20);
                          lVar16 = (long)(int)local_1b0.x * (long)(int)(local_158.y - local_68);
                          uVar22 = 0x10000;
                          if ((uVar27 & 0xfffeffff) == 0) {
                            local_158.x = local_158.x + (long)local_190 * -0x20 * 0x20;
                            local_158.y = local_158.y - local_68;
                            FT_Vector_NormLen(&local_1b0);
                            FT_Vector_NormLen(&local_158);
                            uVar22 = (int)((ulong)((long)(int)local_158.y * (long)(int)local_1b0.x +
                                                   0x8000 + ((long)(int)local_158.y *
                                                             (long)(int)local_1b0.x >> 0x3f)) >>
                                          0x10) -
                                     (int)((ulong)((long)(int)(uint)local_158.x *
                                                   (long)(int)local_1b0.y + 0x8000 +
                                                  ((long)(int)(uint)local_158.x *
                                                   (long)(int)local_1b0.y >> 0x3f)) >> 0x10);
                          }
                          bVar43 = -((int)((ulong)(lVar16 + 0x8000 + (lVar16 >> 0x3f)) >> 0x10) <=
                                    (int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10)) | 1;
                          local_1b4 = 0;
                          bVar42 = true;
                          iVar19 = (int)uVar34;
                          uVar34 = local_f8;
                          pSVar36 = local_100;
                          lVar38 = local_b8;
                          pSVar39 = local_c0;
                          lVar16 = local_c8;
                          lVar25 = local_168;
                        }
                        else if (SVar1 == SDF_EDGE_LINE) {
                          lVar16 = (pSVar39->start_pos).x;
                          lVar38 = (pSVar39->start_pos).y;
                          local_158.x = (pSVar39->end_pos).x - lVar16;
                          local_158.y = (pSVar39->end_pos).y - lVar38;
                          uVar27 = ((long)pSVar10 - lVar16) * local_158.x;
                          uVar34 = uVar27 + 0x3f;
                          if (-1 < (long)uVar27) {
                            uVar34 = uVar27;
                          }
                          uVar17 = ((long)local_178 - lVar38) * local_158.y;
                          uVar27 = uVar17 + 0x3f;
                          if (-1 < (long)uVar17) {
                            uVar27 = uVar17;
                          }
                          local_168 = lVar25;
                          FVar11 = FT_DivFix((long)((int)(uVar27 >> 6) + (int)(uVar34 >> 6)),
                                             (long)((int)((ulong)(local_158.y * local_158.y) >> 6) +
                                                   (int)((ulong)(local_158.x * local_158.x) >> 6)));
                          uVar22 = 0x10000;
                          uVar31 = (uint)FVar11;
                          uVar23 = 0x10000;
                          if ((int)uVar31 < 0x10000) {
                            uVar23 = uVar31;
                          }
                          uVar34 = (ulong)uVar23;
                          if ((int)uVar23 < 1) {
                            uVar34 = 0;
                          }
                          lVar35 = (long)((int)local_158.x << 10) * uVar34;
                          lVar25 = (long)((int)local_158.y << 10) * uVar34;
                          local_1b0.x = (lVar16 - (long)pSVar10) * 0x400 +
                                        (lVar35 + 0x8000 + (lVar35 >> 0x3f) >> 0x10);
                          local_1b0.y = (lVar38 - (long)pFVar5) * 0x400 +
                                        (lVar25 + 0x8000 + (lVar25 >> 0x3f) >> 0x10);
                          lVar16 = (long)(int)local_158.y * (long)(int)local_1b0.x;
                          lVar25 = (long)(int)local_158.x * (long)(int)local_1b0.y;
                          FVar12 = FT_Vector_Length(&local_1b0);
                          iVar19 = (int)FVar12;
                          if (0xfffe < uVar31 - 1) {
                            FT_Vector_NormLen(&local_158);
                            FT_Vector_NormLen(&local_1b0);
                            uVar22 = (int)((ulong)((long)(int)local_1b0.y *
                                                   (long)(int)(uint)local_158.x + 0x8000 +
                                                  ((long)(int)local_1b0.y *
                                                   (long)(int)(uint)local_158.x >> 0x3f)) >> 0x10) -
                                     (int)((ulong)((long)(int)local_1b0.x * (long)(int)local_158.y +
                                                   0x8000 + ((long)(int)local_1b0.x *
                                                             (long)(int)local_158.y >> 0x3f)) >>
                                          0x10);
                          }
                          bVar43 = -((int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10) <=
                                    (int)((ulong)(lVar16 + 0x8000 + (lVar16 >> 0x3f)) >> 0x10)) | 1;
                          local_1b4 = 0;
                          bVar42 = true;
                          uVar34 = local_f8;
                          pSVar36 = local_100;
                          lVar38 = local_b8;
                          pSVar39 = local_c0;
                          lVar16 = local_c8;
                          lVar25 = local_168;
                        }
                        else {
                          local_1b4 = 6;
                          iVar19 = 0x7fffffff;
                          uVar22 = 0;
                          bVar43 = 0;
                          bVar42 = false;
                        }
                        uVar23 = 2;
                        if (bVar42) {
                          bVar13 = -bVar43;
                          if ((int)local_40 != 1) {
                            bVar13 = bVar43;
                          }
                          uVar23 = 0x10;
                          if (iVar19 <= (int)local_184) {
                            uVar27 = (ulong)(uint)((int)local_48 + (int)lVar25);
                            puVar8 = local_180 + uVar27 * 3;
                            if ((byte)local_180[uVar27 * 3 + 2] == 0) {
                              *(ulong *)puVar8 = CONCAT44(uVar22,iVar19);
                              *(byte *)(puVar8 + 2) = bVar13;
                              *(undefined2 *)((long)puVar8 + 9) = 0;
                              *(undefined1 *)((long)puVar8 + 0xb) = 0;
                              uVar23 = 0;
                            }
                            else {
                              uVar31 = *puVar8 - iVar19;
                              uVar23 = -uVar31;
                              if (0 < (int)uVar31) {
                                uVar23 = uVar31;
                              }
                              if (uVar23 < 0x21) {
                                uVar31 = (uint)((ulong)*(undefined8 *)puVar8 >> 0x20);
                                uVar23 = -uVar31;
                                if (0 < (int)uVar31) {
                                  uVar23 = uVar31;
                                }
                                uVar31 = -uVar22;
                                if (0 < (int)uVar22) {
                                  uVar31 = uVar22;
                                }
                                uVar4 = CONCAT44(uVar22,iVar19);
                                if (uVar31 < uVar23) {
                                  uVar4 = *(undefined8 *)puVar8;
                                  bVar13 = (byte)local_180[uVar27 * 3 + 2];
                                }
                                *(undefined8 *)puVar8 = uVar4;
                                *(byte *)(puVar8 + 2) = bVar13;
                              }
                              else if (iVar19 < (int)*puVar8) {
                                *(ulong *)puVar8 = CONCAT44(uVar22,iVar19);
                                *(byte *)(puVar8 + 2) = bVar13;
                                *(undefined2 *)((long)puVar8 + 9) = 0;
                                *(undefined1 *)((long)puVar8 + 0xb) = 0;
                              }
                              uVar23 = 0;
                            }
                          }
                        }
                      }
                      if ((uVar23 & 0xf) != 0) goto LAB_00243f06;
                      lVar25 = lVar25 + 1;
                    } while (lVar25 < lVar16);
                  }
                  lVar38 = lVar38 + 1;
                } while (lVar38 < local_50);
              }
              pSVar39 = pSVar39->next;
              uVar23 = 0;
LAB_00243f06:
            } while (uVar23 == 0);
          } while (uVar23 == 0);
          puVar8 = local_180;
          pFVar33 = local_170;
          if (uVar23 != 2) {
            return uVar23;
          }
        }
      }
    }
LAB_00242edf:
    ft_mem_free(pFVar33,puVar8);
  }
  return local_1b4;
}

Assistant:

static FT_Error
  sdf_generate_subdivision( const SDF_Params  internal_params,
                            SDF_Shape*        shape,
                            FT_UInt           spread,
                            const FT_Bitmap*  bitmap )
  {
    /*
     * Thanks to Alexei for providing the idea of this optimization.
     *
     * We take advantage of two facts.
     *
     * (1) Computing the shortest distance from a point to a line segment is
     *     very fast.
     * (2) We don't have to compute the shortest distance for the entire
     *     two-dimensional grid.
     *
     * Both ideas lead to the following optimization.
     *
     * (1) Split the outlines into a number of line segments.
     *
     * (2) For each line segment, only process its neighborhood.
     *
     * (3) Compute the closest distance to the line only for neighborhood
     *     grid points.
     *
     * This greatly reduces the number of grid points to check.
     */

    FT_Error  error = FT_Err_Ok;


    FT_CALL( split_sdf_shape( shape ) );
    FT_CALL( sdf_generate_bounding_box( internal_params,
                                        shape, spread, bitmap ) );

  Exit:
    return error;
  }